

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  char decimal_point_00;
  size_t sVar2;
  long lVar3;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar4;
  appender aVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  float_specs fVar13;
  ulong uVar14;
  char *pcVar15;
  char cVar16;
  uint uVar17;
  undefined1 *puVar18;
  big_decimal_fp *pbVar19;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_e3 [27];
  float_specs local_c8;
  undefined1 local_bc [8];
  int iStack_b4;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98;
  anon_class_72_9_0c6a3a8a local_90;
  void *local_48;
  float_specs local_40;
  _Alloc_hider local_38;
  
  fVar1 = (float_specs)f->significand;
  iVar6 = f->significand_size;
  local_e3[2] = 0x30;
  cVar16 = fspecs._5_1_;
  pbVar19 = (big_decimal_fp *)(ulong)((iVar6 + 1) - (uint)(cVar16 == '\0'));
  uVar17 = fspecs._4_4_;
  local_e3[0] = '.';
  fVar13 = fspecs;
  local_e3[1] = cVar16;
  local_e3._7_4_ = iVar6;
  local_c8 = fVar1;
  local_38._M_p = (pointer)fspecs;
  if ((uVar17 >> 0x11 & 1) != 0) {
    local_e3._11_8_ = f;
    local_e3._19_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    local_48 = loc.locale_;
    local_40 = fspecs;
    local_e3[0] = decimal_point_impl<char>(loc);
    fVar13 = local_40;
    f = (big_decimal_fp *)local_e3._11_8_;
    out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_e3._19_8_;
    loc.locale_ = local_48;
  }
  uVar12 = f->exponent;
  iVar8 = iVar6 + uVar12;
  iVar11 = fVar13.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0012a38f:
    iVar10 = iVar6 + uVar12 + -1;
    if ((uVar17 >> 0x13 & 1) == 0) {
      uVar14 = 0;
      if (iVar6 == 1) {
        local_e3[0] = '\0';
        uVar14 = 0;
      }
    }
    else {
      uVar14 = 0;
      if (0 < iVar11 - iVar6) {
        uVar14 = (ulong)(uint)(iVar11 - iVar6);
      }
      pbVar19 = (big_decimal_fp *)((long)&pbVar19->significand + uVar14);
    }
    local_90.sign = (sign_t *)CONCAT71(local_90.sign._1_7_,cVar16);
    local_90.significand_size._0_5_ = CONCAT14(local_e3[0],iVar6);
    local_90.f._0_5_ = CONCAT14(0x30,(int)uVar14);
    local_90.f = (big_decimal_fp *)
                 (CONCAT26(local_90.f._6_2_,
                           CONCAT15(((uVar17 >> 0x10 & 1) == 0) << 5,local_90.f._0_5_)) |
                 0x450000000000);
    local_90.grouping = (digit_grouping<char> *)CONCAT44(local_90.grouping._4_4_,iVar10);
    local_90.significand = (char **)fVar1;
    if (0 < specs->width) {
      if (iVar8 < 1) {
        iVar10 = 1 - iVar8;
      }
      lVar3 = 2;
      if (99 < iVar10) {
        lVar3 = (ulong)(999 < iVar10) + 3;
      }
      puVar18 = (undefined1 *)((long)pbVar19 + lVar3 + (3 - (ulong)(local_e3[0] == '\0')));
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        (out,specs,(size_t)puVar18,(size_t)puVar18,
                         (anon_class_40_8_dbbf3351 *)&local_90);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    decimal_point_00 = local_e3[0];
    iVar8 = (int)uVar14;
    if (cVar16 != '\0') {
      cVar16 = ""[(ulong)fspecs >> 0x28 & 0xff];
      sVar2 = ((buffer<char> *)
              out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
      uVar14 = sVar2 + 1;
      if (((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
          ->capacity_ < uVar14) {
        (**((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
           )->_vptr_buffer)();
        sVar2 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->size_;
        uVar14 = sVar2 + 1;
      }
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
      size_ = uVar14;
      ((buffer<char> *)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)->
      ptr_[sVar2] = cVar16;
      decimal_point_00 = local_90.significand_size._4_1_;
      iVar6 = (int)local_90.significand_size;
      iVar8 = (int)local_90.f;
    }
    bVar4.container =
         (buffer<char> *)
         write_significand<fmt::v9::appender,char>
                   (out,(char *)local_90.significand,iVar6,1,decimal_point_00);
    if (0 < iVar8) {
      bVar4.container =
           (buffer<char> *)
           fill_n<fmt::v9::appender,int,char>
                     ((appender)bVar4.container,iVar8,(char *)((long)&local_90.f + 4));
    }
    cVar16 = local_90.f._5_1_;
    sVar2 = (bVar4.container)->size_;
    uVar14 = sVar2 + 1;
    if ((bVar4.container)->capacity_ < uVar14) {
      (**(bVar4.container)->_vptr_buffer)(bVar4.container);
      sVar2 = (bVar4.container)->size_;
      uVar14 = sVar2 + 1;
    }
    (bVar4.container)->size_ = uVar14;
    (bVar4.container)->ptr_[sVar2] = cVar16;
    aVar5 = write_exponent<char,fmt::v9::appender>((int)local_90.grouping,(appender)bVar4.container)
    ;
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar10 = 0x10;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    if ((iVar8 < -3) || (iVar10 < iVar8)) goto LAB_0012a38f;
  }
  local_bc._0_4_ = iVar8;
  if ((int)uVar12 < 0) {
    if (iVar8 < 1) {
      iVar10 = -iVar8;
      local_bc._4_4_ = iVar10;
      if (SBORROW4(iVar11,iVar10) != iVar11 + iVar8 < 0) {
        local_bc._4_4_ = iVar11;
      }
      if (iVar11 < 0) {
        local_bc._4_4_ = iVar10;
      }
      if (iVar6 != 0) {
        local_bc._4_4_ = iVar10;
      }
      if (iVar6 == 0 && local_bc._4_4_ == 0) {
        local_e3[3] = (char)((uVar17 & 0x80000) >> 0x13);
        iVar6 = 1;
        if (((ulong)fspecs & 0x8000000000000) == 0) goto LAB_0012a77a;
      }
      else {
        local_e3[3] = 1;
      }
      iVar6 = 2;
LAB_0012a77a:
      puVar18 = (undefined1 *)((long)&pbVar19->significand + (ulong)(uint)(iVar6 + local_bc._4_4_));
      local_90.sign = local_e3 + 1;
      local_90.significand = (char **)(local_e3 + 2);
      local_90.significand_size = (int *)(local_e3 + 3);
      local_90.f = (big_decimal_fp *)local_e3;
      local_90.grouping = (digit_grouping<char> *)(local_bc + 4);
      local_90.fspecs = &local_c8;
      local_90.decimal_point = local_e3 + 7;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        (out,specs,(size_t)puVar18,(size_t)puVar18,
                         (anon_class_56_7_162c6e41 *)&local_90);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    uVar9 = 0;
    local_e3._3_4_ = iVar11 - iVar6 & (int)(uVar17 << 0xc) >> 0x1f;
    uVar12 = local_e3._3_4_;
    if ((int)local_e3._3_4_ < 1) {
      uVar12 = uVar9;
    }
    local_e3._11_8_ = pbVar19;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)(local_bc + 4),loc,(bool)((byte)(uVar17 >> 0x11) & 1));
    if (local_98 != '\0') {
      pcVar15 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
      pcVar7 = pcVar15 + local_b0;
      lVar3 = 0;
      do {
        if (pcVar15 == pcVar7) {
          cVar16 = pcVar7[-1];
          pcVar15 = pcVar7;
        }
        else {
          cVar16 = *pcVar15;
          if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_0012a6d4;
          pcVar15 = pcVar15 + 1;
        }
        uVar9 = uVar9 + (int)cVar16;
        if ((int)local_e3._7_4_ <= (int)uVar9) goto LAB_0012a6d4;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_0012a6d4:
    puVar18 = (undefined1 *)((long)(char **)local_e3._11_8_ + lVar3 + (ulong)uVar12 + 1);
    local_90.sign = local_e3 + 1;
    local_90.significand = (char **)&local_c8;
    local_90.significand_size = (int *)(local_e3 + 7);
    local_90.f = (big_decimal_fp *)local_bc;
    local_90.grouping = (digit_grouping<char> *)local_e3;
    local_90.decimal_point = local_e3 + 3;
    local_90.num_zeros = (int *)(local_e3 + 2);
    local_90.fspecs = (float_specs *)(local_bc + 4);
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   (out,specs,(size_t)puVar18,(size_t)puVar18,(anon_class_64_8_e6ffa566 *)&local_90)
    ;
    goto LAB_0012a736;
  }
  puVar18 = (undefined1 *)((long)&pbVar19->significand + (ulong)uVar12);
  local_e3._3_4_ = iVar11 - iVar8;
  if ((uVar17 >> 0x13 & 1) != 0) {
    puVar18 = puVar18 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_e3._3_4_) {
      if ((int)local_e3._3_4_ < 1) goto LAB_0012a5d7;
    }
    else {
      local_e3._3_4_ = 1;
    }
    puVar18 = puVar18 + (uint)local_e3._3_4_;
  }
LAB_0012a5d7:
  local_e3._11_8_ = f;
  local_e3._19_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)(local_bc + 4),loc,(bool)((byte)(uVar17 >> 0x11) & 1));
  iVar6 = 0;
  if (local_98 != '\0') {
    pcVar15 = (char *)CONCAT44(iStack_b4,local_bc._4_4_);
    pcVar7 = pcVar15 + local_b0;
    lVar3 = 0;
    do {
      if (pcVar15 == pcVar7) {
        cVar16 = pcVar7[-1];
        pcVar15 = pcVar7;
      }
      else {
        cVar16 = *pcVar15;
        if ((byte)(cVar16 + 0x81U) < 0x82) goto LAB_0012a639;
        pcVar15 = pcVar15 + 1;
      }
      iVar6 = iVar6 + cVar16;
      if (iVar8 <= iVar6) goto LAB_0012a639;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_0012a639:
  local_90.sign = local_e3 + 1;
  local_90.significand = (char **)&local_c8;
  local_90.significand_size = (int *)(local_e3 + 7);
  local_90.f = (big_decimal_fp *)local_e3._11_8_;
  local_90.fspecs = (float_specs *)&local_38;
  local_90.decimal_point = local_e3;
  local_90.num_zeros = (int *)(local_e3 + 3);
  local_90.zero = local_e3 + 2;
  local_90.grouping = (digit_grouping<char> *)(local_bc + 4);
  bVar4.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 ((appender)local_e3._19_8_,specs,(size_t)(puVar18 + lVar3),
                  (size_t)(puVar18 + lVar3),&local_90);
LAB_0012a736:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(iStack_b4,local_bc._4_4_) != &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(iStack_b4,local_bc._4_4_),local_a8._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}